

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinflate.c
# Opt level: O0

int tinf_inflate_dynamic_block(tinf_data *d)

{
  int res;
  tinf_data *d_local;
  
  d_local._4_4_ = tinf_decode_trees(d,&d->ltree,&d->dtree);
  if (d_local._4_4_ == 0) {
    d_local._4_4_ = tinf_inflate_block_data(d,&d->ltree,&d->dtree);
  }
  return d_local._4_4_;
}

Assistant:

static int tinf_inflate_dynamic_block(struct tinf_data *d)
{
	/* Decode trees from stream */
	int res = tinf_decode_trees(d, &d->ltree, &d->dtree);

	if (res != TINF_OK) {
		return res;
	}

	/* Decode block using decoded trees */
	return tinf_inflate_block_data(d, &d->ltree, &d->dtree);
}